

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

bool Intersect(VmInstruction *a,VmInstruction *b)

{
  bool bVar1;
  
  if (a != b) {
    if (b->cmd == VM_INST_DEF) {
      do {
        b = b->nextSibling;
      } while (b->cmd != VM_INST_PARALLEL_COPY);
    }
    bVar1 = IsLiveAt(a,b->nextSibling);
    if (!bVar1) {
      bVar1 = IsLiveAt(b,a->nextSibling);
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool Intersect(VmInstruction *a, VmInstruction *b)
{
	// Same definition
	if(a == b)
		return true;

	// 'def' pseudo-instruction definition locations is at following parallel copy instruction
	if(b->cmd == VM_INST_DEF)
	{
		while(b->cmd != VM_INST_PARALLEL_COPY)
			b = b->nextSibling;
	}

	// a dominates b and a is live just after the definition of b
	if(IsLiveAt(a, b->nextSibling))
		return true;

	// b dominates a and b is live just after the definition of a
	if(IsLiveAt(b, a->nextSibling))
		return true;

	return false;
}